

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O3

int adl_getNextBank(ADL_MIDIPlayer *device,ADL_Bank *bank)

{
  void *pvVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  
  iVar2 = -1;
  if (device != (ADL_MIDIPlayer *)0x0) {
    if (device->adl_midiPlayer == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x161,"int adl_getNextBank(ADL_MIDIPlayer *, ADL_Bank *)");
    }
    pvVar4 = bank->pointer[2];
    pvVar6 = *bank->pointer[1];
    if (pvVar6 == (void *)0x0) {
      pvVar5 = (void *)((long)pvVar4 + 1);
      pvVar1 = pvVar5;
      pvVar3 = (void *)0x100;
      if ((void *)0x100 < pvVar5) {
        pvVar3 = pvVar5;
      }
      do {
        pvVar4 = pvVar1;
        if ((void *)0xff < pvVar4) {
          if (bank->pointer[0] == *(void **)(*(long *)((long)device->adl_midiPlayer + 0x198) + 0xa0)
              && pvVar5 < (void *)0x101) {
            return -1;
          }
          pvVar6 = (void *)0x0;
          pvVar4 = pvVar3;
          break;
        }
        pvVar6 = *(void **)((long)bank->pointer[0] + (long)pvVar4 * 8);
        pvVar1 = (void *)((long)pvVar4 + 1);
      } while (pvVar6 == (void *)0x0);
    }
    bank->pointer[1] = pvVar6;
    bank->pointer[2] = pvVar4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

ADLMIDI_EXPORT int adl_getNextBank(ADL_MIDIPlayer *device, ADL_Bank *bank)
{
    if(!device)
        return -1;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth::BankMap &map = play->m_synth->m_insBanks;

    Synth::BankMap::iterator it = Synth::BankMap::iterator::from_ptrs(bank->pointer);
    if(++it == map.end())
        return -1;

    it.to_ptrs(bank->pointer);
    return 0;
}